

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_hex
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char cVar1;
  uint uVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  basic_format_specs<char> *in_RDI;
  int unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  buffer_appender<char> in_stack_00000018;
  anon_class_16_2_cb75083a_for_f in_stack_00000030;
  int num_digits;
  basic_format_specs<char> *specs;
  
  if (*(char *)((long)&(*(buffer<char> **)(in_RDI + 1))->ptr_ + 1) < '\0') {
    uVar2 = in_RDI[2].width;
    in_RDI[2].width = uVar2 + 1;
    in_RDI[1].fill.data_[(ulong)uVar2 + 2] = '0';
    cVar1 = *(char *)&(*(buffer<char> **)(in_RDI + 1))->ptr_;
    uVar2 = in_RDI[2].width;
    in_RDI[2].width = uVar2 + 1;
    in_RDI[1].fill.data_[(ulong)uVar2 + 2] = cVar1;
  }
  uVar2._0_1_ = in_RDI[1].type;
  uVar2._1_1_ = in_RDI[1].field_0x9;
  uVar2._2_1_ = in_RDI[1].fill.data_[0];
  uVar2._3_1_ = in_RDI[1].fill.data_[1];
  specs = in_RDI;
  count_digits<4u,unsigned_int>(uVar2);
  get_prefix((int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *)0x18cfab);
  bVar3.container =
       (buffer<char> *)
       write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_int>::on_hex()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                 (in_stack_00000018,unaff_retaddr,(string_view)in_stack_00000008,specs,
                  in_stack_00000030);
  *(buffer<char> **)in_RDI = bVar3.container;
  return;
}

Assistant:

void on_hex() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = specs.type;
    }
    int num_digits = count_digits<4>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<4, Char>(it, abs_value, num_digits,
                                                  specs.type != 'x');
                    });
  }